

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O2

void __thiscall amrex::IArrayBox::readFrom(IArrayBox *this,istream *is)

{
  bool bVar1;
  IFABio *this_00;
  int tmp_ncomp;
  IntDescriptor data_descriptor;
  Box tmp_box;
  string type;
  
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  std::operator>>(is,(string *)&type);
  bVar1 = std::operator!=(&type,"IFAB");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&data_descriptor,
               "IArrayBox::readFrom: IFAB is expected, but instead we have ",(allocator *)&tmp_ncomp
              );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_box,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &data_descriptor,&type);
    Error((string *)&tmp_box);
    std::__cxx11::string::~string((string *)&tmp_box);
    std::__cxx11::string::~string((string *)&data_descriptor);
  }
  IntDescriptor::IntDescriptor(&data_descriptor);
  amrex::operator>>(is,&data_descriptor);
  tmp_box.smallend.vect[0] = 1;
  tmp_box.smallend.vect[1] = 1;
  tmp_box.smallend.vect[2] = 1;
  tmp_box.bigend.vect[0] = 0;
  tmp_box.bigend.vect[1] = 0;
  tmp_box.bigend.vect[2] = 0;
  tmp_box.btype.itype = 0;
  amrex::operator>>(is,&tmp_box);
  std::istream::operator>>((istream *)is,&tmp_ncomp);
  std::istream::ignore((long)is,99999);
  this_00 = (IFABio *)&(this->super_BaseFab<int>).domain;
  bVar1 = Box::operator!=((Box *)this_00,&tmp_box);
  if ((bVar1) || ((this->super_BaseFab<int>).nvar != tmp_ncomp)) {
    this_00 = (IFABio *)this;
    resize(this,&tmp_box,tmp_ncomp,(Arena *)0x0);
  }
  IFABio::read(this_00,(int)is,this,(size_t)&data_descriptor);
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void
IArrayBox::readFrom (std::istream& is)
{
    std::string type;
    is >> type;
    if (type != "IFAB") {
        amrex::Error(std::string("IArrayBox::readFrom: IFAB is expected, but instead we have ")
                     +type);
    }

    IntDescriptor data_descriptor;
    is >> data_descriptor;

    Box tmp_box;
    int tmp_ncomp;
    is >> tmp_box;
    is >> tmp_ncomp;
    is.ignore(99999, '\n');

    if (this->box() != tmp_box || this->nComp() != tmp_ncomp) {
        this->resize(tmp_box, tmp_ncomp);
    }

#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        IArrayBox hostfab(this->box(), this->nComp(), The_Pinned_Arena());
        ifabio->read(is, hostfab, data_descriptor);
        Gpu::htod_memcpy_async(this->dataPtr(), hostfab.dataPtr(),
                               hostfab.size()*sizeof(IArrayBox::value_type));
        Gpu::streamSynchronize();
    } else
#endif
    {
        ifabio->read(is, *this, data_descriptor);
    }
}